

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error PVG_FT_Stroker_ConicTo(PVG_FT_Stroker stroker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  PVG_FT_Bool PVar1;
  int iVar2;
  PVG_FT_Angle PVar3;
  long lVar4;
  PVG_FT_Fixed PVar5;
  PVG_FT_Long PVar6;
  long lVar7;
  PVG_FT_Angle PVar8;
  PVG_FT_Pos PVar9;
  PVG_FT_Angle PVar10;
  PVG_FT_Fixed PVar11;
  PVG_FT_Pos c;
  PVG_FT_Long length_00;
  PVG_FT_Fixed alen;
  PVG_FT_Fixed sinB;
  PVG_FT_Fixed sinA;
  PVG_FT_Fixed blen;
  PVG_FT_Vector delta;
  PVG_FT_Vector bvec;
  PVG_FT_Angle gamma;
  PVG_FT_Angle beta;
  PVG_FT_Angle alpha1;
  PVG_FT_Vector start;
  PVG_FT_StrokeBorder pPStack_2c0;
  PVG_FT_Int side;
  PVG_FT_StrokeBorder border;
  PVG_FT_Fixed length;
  PVG_FT_Angle alpha0;
  PVG_FT_Angle rotate;
  PVG_FT_Angle phi;
  PVG_FT_Angle theta;
  PVG_FT_Vector end;
  PVG_FT_Vector ctrl;
  PVG_FT_Angle angle_out;
  PVG_FT_Angle angle_in;
  PVG_FT_Vector *pPStack_258;
  PVG_FT_Bool first_arc;
  PVG_FT_Vector *limit;
  PVG_FT_Vector *arc;
  PVG_FT_Vector bez_stack [34];
  PVG_FT_Error error;
  PVG_FT_Vector *to_local;
  PVG_FT_Vector *control_local;
  PVG_FT_Stroker stroker_local;
  
  bez_stack[0x21].y._4_4_ = 0;
  pPStack_258 = (PVG_FT_Vector *)&bez_stack[0x1d].y;
  angle_in._7_1_ = '\x01';
  if ((((((stroker->center).x - control->x < -1) || (1 < (stroker->center).x - control->x)) ||
       ((stroker->center).y - control->y < -1)) ||
      ((1 < (stroker->center).y - control->y || (control->x - to->x < -1)))) ||
     ((1 < control->x - to->x || ((control->y - to->y < -1 || (1 < control->y - to->y)))))) {
    limit = (PVG_FT_Vector *)&arc;
    arc = (PVG_FT_Vector *)to->x;
    bez_stack[0].x = to->y;
    bez_stack[0].y = control->x;
    bez_stack[1].x = control->y;
    bez_stack[1].y = (stroker->center).x;
    bez_stack[2].x = (stroker->center).y;
    while ((PVG_FT_Vector *)&arc <= limit) {
      ctrl.y = stroker->angle_in;
      angle_out = ctrl.y;
      if ((limit < pPStack_258) &&
         (PVar1 = ft_conic_is_small_enough(limit,&angle_out,&ctrl.y), PVar1 == '\0')) {
        if (stroker->first_point != '\0') {
          stroker->angle_in = angle_out;
        }
        ft_conic_split(limit);
        limit = limit + 2;
      }
      else {
        if (angle_in._7_1_ == '\0') {
          PVar3 = PVG_FT_Angle_Diff(stroker->angle_in,angle_out);
          PVar9 = ft_pos_abs(PVar3);
          if (0x78000 < PVar9) {
            (stroker->center).x = limit[2].x;
            (stroker->center).y = limit[2].y;
            stroker->angle_out = angle_out;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
            bez_stack[0x21].y._4_4_ = ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
          }
        }
        else {
          angle_in._7_1_ = '\0';
          if (stroker->first_point == '\0') {
            stroker->angle_out = angle_out;
            bez_stack[0x21].y._4_4_ = ft_stroker_process_corner(stroker,0);
          }
          else {
            bez_stack[0x21].y._4_4_ = ft_stroker_subpath_start(stroker,angle_out,0);
          }
        }
        if (bez_stack[0x21].y._4_4_ != 0) {
          return bez_stack[0x21].y._4_4_;
        }
        length = 0;
        PVar3 = PVG_FT_Angle_Diff(angle_out,ctrl.y);
        lVar4 = angle_out + PVar3 / 2;
        PVar6 = stroker->radius;
        PVar5 = PVG_FT_Cos(PVar3 / 2);
        PVar6 = PVG_FT_DivFix(PVar6,PVar5);
        if (stroker->handle_wide_strokes != '\0') {
          length = PVG_FT_Atan2(limit->x - limit[2].x,limit->y - limit[2].y);
        }
        pPStack_2c0 = stroker->borders;
        for (start.y._4_4_ = 0; start.y._4_4_ < 2; start.y._4_4_ = start.y._4_4_ + 1) {
          lVar7 = (long)start.y._4_4_ * -0xb40000 + 0x5a0000;
          PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&end.y,PVar6,lVar4 + lVar7);
          end.y = limit[1].x + end.y;
          ctrl.x = limit[1].y + ctrl.x;
          PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&theta,stroker->radius,ctrl.y + lVar7);
          theta = limit->x + theta;
          end.x = limit->y + end.x;
          if (stroker->handle_wide_strokes == '\0') {
LAB_00183f39:
            iVar2 = ft_stroke_border_conicto
                              (pPStack_2c0,(PVG_FT_Vector *)&end.y,(PVG_FT_Vector *)&theta);
          }
          else {
            alpha1 = pPStack_2c0->points[pPStack_2c0->num_points - 1].x;
            start.x = pPStack_2c0->points[pPStack_2c0->num_points - 1].y;
            PVar3 = PVG_FT_Atan2(theta - alpha1,end.x - start.x);
            PVar8 = PVG_FT_Angle_Diff(length,PVar3);
            PVar9 = ft_pos_abs(PVar8);
            if (PVar9 < 0x5a0001) goto LAB_00183f39;
            PVar8 = PVG_FT_Atan2(limit[2].x - alpha1,limit[2].y - start.x);
            PVar10 = PVG_FT_Atan2(limit->x - theta,limit->y - end.x);
            delta.y = theta - alpha1;
            PVar5 = PVG_FT_Vector_Length((PVG_FT_Vector *)&delta.y);
            PVar11 = PVG_FT_Sin(PVar3 - PVar10);
            PVar9 = ft_pos_abs(PVar11);
            PVar11 = PVG_FT_Sin(PVar8 - PVar10);
            c = ft_pos_abs(PVar11);
            length_00 = PVG_FT_MulDiv(PVar5,PVar9,c);
            PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&blen,length_00,PVar8);
            blen = alpha1 + blen;
            delta.x = start.x + delta.x;
            pPStack_2c0->movable = '\0';
            bez_stack[0x21].y._4_4_ =
                 ft_stroke_border_lineto(pPStack_2c0,(PVG_FT_Vector *)&blen,'\0');
            if (bez_stack[0x21].y._4_4_ != 0) {
              return bez_stack[0x21].y._4_4_;
            }
            bez_stack[0x21].y._4_4_ =
                 ft_stroke_border_lineto(pPStack_2c0,(PVG_FT_Vector *)&theta,'\0');
            if (bez_stack[0x21].y._4_4_ != 0) {
              return bez_stack[0x21].y._4_4_;
            }
            bez_stack[0x21].y._4_4_ =
                 ft_stroke_border_conicto
                           (pPStack_2c0,(PVG_FT_Vector *)&end.y,(PVG_FT_Vector *)&alpha1);
            if (bez_stack[0x21].y._4_4_ != 0) {
              return bez_stack[0x21].y._4_4_;
            }
            iVar2 = ft_stroke_border_lineto(pPStack_2c0,(PVG_FT_Vector *)&theta,'\0');
          }
          if (iVar2 != 0) {
            return iVar2;
          }
          pPStack_2c0 = pPStack_2c0 + 1;
          bez_stack[0x21].y._4_4_ = 0;
        }
        limit = limit + -2;
        stroker->angle_in = ctrl.y;
      }
    }
    (stroker->center).x = to->x;
    (stroker->center).y = to->y;
    stroker->line_length = 0;
  }
  else {
    (stroker->center).x = to->x;
    (stroker->center).y = to->y;
  }
  return bez_stack[0x21].y._4_4_;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ConicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control,
                                  PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[34];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 30;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner                       */
    if (PVG_FT_IS_SMALL(stroker->center.x - control->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control->y) &&
        PVG_FT_IS_SMALL(control->x - to->x) &&
        PVG_FT_IS_SMALL(control->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control;
    arc[2] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = stroker->angle_in;

        if (arc < limit &&
            !ft_conic_is_small_enough(arc, &angle_in, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_conic_split(arc);
            arc += 2;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CONIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[2];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl, end;
            PVG_FT_Angle        theta, phi, rotate, alpha0 = 0;
            PVG_FT_Fixed        length;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta = PVG_FT_Angle_Diff(angle_in, angle_out) / 2;
            phi = angle_in + theta;
            length = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[2].x, arc[0].y - arc[2].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control point */
                PVG_FT_Vector_From_Polar(&ctrl, length, phi + rotate);
                ctrl.x += arc[1].x;
                ctrl.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[2].x - start.x, arc[2].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_conicto(border, &ctrl, &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_conicto(border, &ctrl, &end);
                if (error) goto Exit;
            }
        }

        arc -= 2;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}